

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

xmlListPtr xmlListCreate(xmlListDeallocator deallocator,xmlListDataCompare compare)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  void *pvVar4;
  xmlListPtr l;
  xmlListDataCompare compare_local;
  xmlListDeallocator deallocator_local;
  
  deallocator_local = (xmlListDeallocator)(*xmlMalloc)(0x18);
  if (deallocator_local == (xmlListDeallocator)0x0) {
    pp_Var2 = __xmlGenericError();
    p_Var1 = *pp_Var2;
    ppvVar3 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar3,"Cannot initialize memory for list");
    deallocator_local = (xmlListDeallocator)0x0;
  }
  else {
    memset(deallocator_local,0,0x18);
    pvVar4 = (*xmlMalloc)(0x18);
    *(void **)deallocator_local = pvVar4;
    if (pvVar4 == (void *)0x0) {
      pp_Var2 = __xmlGenericError();
      p_Var1 = *pp_Var2;
      ppvVar3 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar3,"Cannot initialize memory for sentinel");
      (*xmlFree)(deallocator_local);
      deallocator_local = (xmlListDeallocator)0x0;
    }
    else {
      **(long **)deallocator_local = *(long *)deallocator_local;
      *(long *)(*(long *)deallocator_local + 8) = *(long *)deallocator_local;
      *(undefined8 *)(*(long *)deallocator_local + 0x10) = 0;
      if (deallocator != (xmlListDeallocator)0x0) {
        *(xmlListDeallocator *)(deallocator_local + 8) = deallocator;
      }
      if (compare == (xmlListDataCompare)0x0) {
        *(code **)(deallocator_local + 0x10) = xmlLinkCompare;
      }
      else {
        *(xmlListDataCompare *)(deallocator_local + 0x10) = compare;
      }
    }
  }
  return (xmlListPtr)deallocator_local;
}

Assistant:

xmlListPtr
xmlListCreate(xmlListDeallocator deallocator, xmlListDataCompare compare)
{
    xmlListPtr l;
    if (NULL == (l = (xmlListPtr )xmlMalloc( sizeof(xmlList)))) {
        xmlGenericError(xmlGenericErrorContext,
		        "Cannot initialize memory for list");
        return (NULL);
    }
    /* Initialize the list to NULL */
    memset(l, 0, sizeof(xmlList));

    /* Add the sentinel */
    if (NULL ==(l->sentinel = (xmlLinkPtr )xmlMalloc(sizeof(xmlLink)))) {
        xmlGenericError(xmlGenericErrorContext,
		        "Cannot initialize memory for sentinel");
	xmlFree(l);
        return (NULL);
    }
    l->sentinel->next = l->sentinel;
    l->sentinel->prev = l->sentinel;
    l->sentinel->data = NULL;

    /* If there is a link deallocator, use it */
    if (deallocator != NULL)
        l->linkDeallocator = deallocator;
    /* If there is a link comparator, use it */
    if (compare != NULL)
        l->linkCompare = compare;
    else /* Use our own */
        l->linkCompare = xmlLinkCompare;
    return l;
}